

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall
cmLocalGenerator::JoinDefines
          (cmLocalGenerator *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *defines,string *definesString,string *lang)

{
  _Rb_tree_node_base *p_Var1;
  char *pcVar2;
  bool bVar3;
  char *__s;
  long lVar4;
  _Base_ptr p_Var5;
  char cVar6;
  byte *pbVar7;
  string defineFlagVar;
  string dflag;
  string local_d0;
  string local_b0;
  cmLocalGenerator *local_90;
  string *local_88;
  long *local_80;
  char *local_78;
  long local_70 [2];
  cmOutputConverter *local_60;
  _Rb_tree_node_base *local_58;
  string local_50;
  
  local_80 = local_70;
  local_90 = this;
  local_88 = definesString;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"-D","");
  if (lang->_M_string_length != 0) {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"CMAKE_","");
    std::__cxx11::string::_M_append((char *)&local_d0,(ulong)(lang->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_d0);
    __s = cmMakefile::GetDefinition(local_90->Makefile,&local_d0);
    pcVar2 = local_78;
    if ((__s != (char *)0x0) && (*__s != '\0')) {
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)&local_80,0,pcVar2,(ulong)__s);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
  }
  p_Var5 = (defines->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_58 = &(defines->_M_t)._M_impl.super__Rb_tree_header._M_header;
  if (p_Var5 != local_58) {
    local_60 = &local_90->super_cmOutputConverter;
    do {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,local_80,local_78 + (long)local_80);
      bVar3 = cmState::UseWatcomWMake
                        ((local_90->GlobalGenerator->CMakeInstance->State)._M_t.
                         super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                         super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                         super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
      p_Var1 = p_Var5 + 1;
      if (bVar3) {
        pbVar7 = *(byte **)p_Var1;
        do {
          cVar6 = (char)&local_d0;
          if (*pbVar7 - 0x23 < 2) {
            std::__cxx11::string::push_back(cVar6);
          }
          else if (*pbVar7 == 0) goto LAB_00310083;
          std::__cxx11::string::push_back(cVar6);
          pbVar7 = pbVar7 + 1;
        } while( true );
      }
      lVar4 = std::__cxx11::string::find((char)p_Var1,0x3d);
      std::__cxx11::string::substr((ulong)&local_b0,(ulong)p_Var1);
      std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_b0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if (lVar4 != -1) {
        std::__cxx11::string::append((char *)&local_d0);
        std::__cxx11::string::substr((ulong)&local_50,(ulong)p_Var1);
        cmOutputConverter::EscapeForShell(&local_b0,local_60,&local_50,true,false,false);
        std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_b0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
LAB_00310083:
      std::__cxx11::string::append((char *)local_88);
      std::__cxx11::string::_M_append((char *)local_88,(ulong)local_d0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while (p_Var5 != local_58);
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  return;
}

Assistant:

void cmLocalGenerator::JoinDefines(const std::set<std::string>& defines,
                                   std::string& definesString,
                                   const std::string& lang)
{
  // Lookup the define flag for the current language.
  std::string dflag = "-D";
  if (!lang.empty()) {
    std::string defineFlagVar = "CMAKE_";
    defineFlagVar += lang;
    defineFlagVar += "_DEFINE_FLAG";
    const char* df = this->Makefile->GetDefinition(defineFlagVar);
    if (df && *df) {
      dflag = df;
    }
  }
  const char* itemSeparator = definesString.empty() ? "" : " ";
  for (std::string const& define : defines) {
    // Append the definition with proper escaping.
    std::string def = dflag;
    if (this->GetState()->UseWatcomWMake()) {
      // The Watcom compiler does its own command line parsing instead
      // of using the windows shell rules.  Definitions are one of
      //   -DNAME
      //   -DNAME=<cpp-token>
      //   -DNAME="c-string with spaces and other characters(?@#$)"
      //
      // Watcom will properly parse each of these cases from the
      // command line without any escapes.  However we still have to
      // get the '$' and '#' characters through WMake as '$$' and
      // '$#'.
      for (const char* c = define.c_str(); *c; ++c) {
        if (*c == '$' || *c == '#') {
          def += '$';
        }
        def += *c;
      }
    } else {
      // Make the definition appear properly on the command line.  Use
      // -DNAME="value" instead of -D"NAME=value" for historical reasons.
      std::string::size_type eq = define.find('=');
      def += define.substr(0, eq);
      if (eq != std::string::npos) {
        def += "=";
        def += this->EscapeForShell(define.substr(eq + 1), true);
      }
    }
    definesString += itemSeparator;
    itemSeparator = " ";
    definesString += def;
  }
}